

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.h
# Opt level: O1

StatusOr<google::protobuf::json_internal::UntypedMessage> *
google::protobuf::json_internal::UntypedMessage::ParseFromStream
          (StatusOr<google::protobuf::json_internal::UntypedMessage> *__return_storage_ptr__,
          Message *desc,CodedInputStream *stream)

{
  Status _status;
  UntypedMessage msg;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  code *local_20;
  
  local_30._0_8_ = 0;
  local_30._8_8_ = (ctrl_t *)0x0;
  local_20 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_40._8_8_ = desc;
  Decode((UntypedMessage *)local_40,(CodedInputStream *)(local_40 + 8),(optional<int>)stream);
  if ((Message *)local_40._0_8_ == (Message *)0x1) {
    (__return_storage_ptr__->super_StatusOrData<google::protobuf::json_internal::UntypedMessage>).
    field_1.data_.desc_ = (Message *)local_40._8_8_;
    absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::raw_hash_set
              ((raw_hash_set<_2385b75b_> *)
               &(__return_storage_ptr__->
                super_StatusOrData<google::protobuf::json_internal::UntypedMessage>).field_1.data_.
                fields_,(raw_hash_set<_2385b75b_> *)local_30);
    (__return_storage_ptr__->super_StatusOrData<google::protobuf::json_internal::UntypedMessage>).
    field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::UntypedMessage>_1
               )0x1;
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::UntypedMessage>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<google::protobuf::json_internal::UntypedMessage>,
               (Status *)local_40);
    absl::lts_20240722::Status::~Status((Status *)local_40);
  }
  absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::~raw_hash_set
            ((raw_hash_set<_2385b75b_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<UntypedMessage> ParseFromStream(
      const ResolverPool::Message* desc, io::CodedInputStream& stream) {
    UntypedMessage msg(std::move(desc));
    RETURN_IF_ERROR(msg.Decode(stream));
    return std::move(msg);
  }